

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgreen_value.c
# Opt level: O0

CgreenValue * make_cgreen_string_value(char *string)

{
  char *pcVar1;
  CgreenValue *in_RDI;
  CgreenValue *value;
  CgreenValue *pCVar2;
  
  *(undefined8 *)in_RDI = 1;
  (in_RDI->value).integer_value = 0;
  in_RDI->value_size = 8;
  pCVar2 = in_RDI;
  pcVar1 = stringdup((char *)in_RDI);
  (pCVar2->value).string_value = pcVar1;
  return in_RDI;
}

Assistant:

CgreenValue make_cgreen_string_value(const char *string) {
    CgreenValue value = {CGREEN_STRING, {0}, sizeof(const char *)};
    value.value.string_value = stringdup(string);
    return value;
}